

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void fl_init_xim(void)

{
  char *pcVar1;
  XIMStyles *xim_styles;
  short *local_10;
  
  if (0 < fl_init_xim::xim_warning) {
    fl_init_xim::xim_warning = fl_init_xim::xim_warning + -1;
  }
  if (fl_display == (Display *)0x0) {
    return;
  }
  if (fl_xim_im != (XIM)0x0) {
    return;
  }
  fl_xim_im = (XIM)XOpenIM(fl_display,0,0,0);
  local_10 = (short *)0x0;
  fl_xim_ic = (XIC)0x0;
  if (fl_xim_im == (XIM)0x0) {
    if (fl_init_xim::xim_warning == 0) {
      fl_xim_ic = (XIC)0x0;
      return;
    }
    (*Fl::warning)("XOpenIM() failed");
    return;
  }
  XGetIMValues(fl_xim_im,"queryInputStyle",&local_10,0,0);
  if ((local_10 == (short *)0x0) || (*local_10 == 0)) {
    if (fl_init_xim::xim_warning != 0) {
      pcVar1 = "No XIM style found";
LAB_0018c8cf:
      (*Fl::warning)(pcVar1);
    }
  }
  else {
    fl_new_ic();
    if (fl_xim_ic != (XIC)0x0) goto LAB_0018c8ea;
    if (fl_init_xim::xim_warning != 0) {
      pcVar1 = "XCreateIC() failed";
      goto LAB_0018c8cf;
    }
  }
  XCloseIM(fl_xim_im);
  fl_xim_im = (XIM)0x0;
LAB_0018c8ea:
  if (local_10 != (short *)0x0) {
    XFree();
  }
  return;
}

Assistant:

static void fl_init_xim() {
  static int xim_warning = 2;
  if (xim_warning > 0) xim_warning--;

  //XIMStyle *style;
  XIMStyles *xim_styles;
  if (!fl_display) return;
  if (fl_xim_im) return;

  fl_xim_im = XOpenIM(fl_display, NULL, NULL, NULL);
  xim_styles = NULL;
  fl_xim_ic = NULL;

  if (fl_xim_im) {
    XGetIMValues (fl_xim_im, XNQueryInputStyle,
                  &xim_styles, NULL, NULL);
  } else {
    if (xim_warning)
      Fl::warning("XOpenIM() failed");
    // if xim_styles is allocated, free it now
    if (xim_styles) XFree(xim_styles);
    return;
  }

  if (xim_styles && xim_styles->count_styles) {
    fl_new_ic();
   } else {
     if (xim_warning)
       Fl::warning("No XIM style found");
     XCloseIM(fl_xim_im);
     fl_xim_im = NULL;
     // if xim_styles is allocated, free it now
     if (xim_styles) XFree(xim_styles);
     return;
  }
  if (!fl_xim_ic) {
    if (xim_warning)
      Fl::warning("XCreateIC() failed");
    XCloseIM(fl_xim_im);
    fl_xim_im = NULL;
  }
  // if xim_styles is still allocated, free it now
  if(xim_styles) XFree(xim_styles);
}